

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O3

Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
* __thiscall
Lib::
ProxyIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>,_Lib::SingletonIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
::next(Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
       *__return_storage_ptr__,
      ProxyIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>,_Lib::SingletonIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
      *this)

{
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>
  *pDVar1;
  anon_class_16_2_f84bbffd f;
  
  (this->
  super_IteratorCore<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>
  ).field_0xc = 1;
  pDVar1 = &(__return_storage_ptr__->_inner).
            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
            .
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>
  ;
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x1f] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x20] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x21] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x22] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x23] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x24] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x25] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x26] = '\0';
  pDVar1 = &(__return_storage_ptr__->_inner).
            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
            .
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>
  ;
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x27] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x28] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x29] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x2a] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x2b] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x2c] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x2d] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x2e] = '\0';
  pDVar1 = &(__return_storage_ptr__->_inner).
            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
            .
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>
  ;
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0xf] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x10] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x11] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x12] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x13] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x14] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x15] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x16] = '\0';
  pDVar1 = &(__return_storage_ptr__->_inner).
            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
            .
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>
  ;
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x17] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x18] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x19] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x1a] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x1b] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x1c] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x1d] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0x1e] = '\0';
  *(undefined8 *)
   &(__return_storage_ptr__->_inner).
    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
    .
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>
    .
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
       = 0;
  pDVar1 = &(__return_storage_ptr__->_inner).
            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
            .
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>
  ;
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[7] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[8] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[9] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[10] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0xb] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0xc] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0xd] = '\0';
  (pDVar1->
  super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
  )._content[0xe] = '\0';
  *(undefined4 *)
   ((__return_storage_ptr__->_inner).
    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
    .
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>
    .
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
    ._content + 0x2f) = 0;
  *(byte *)&(__return_storage_ptr__->_inner).
            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
            .
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>
            .
            super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>
       = this->field_0x10 & 3;
  f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>
             *)&this->field_0x10;
  f.this = &__return_storage_ptr__->_inner;
  CoproductImpl::
  RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>>>>const&)::_lambda(auto:1)_1_>
            ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>
              *)__return_storage_ptr__,f);
  return __return_storage_ptr__;
}

Assistant:

bool hasNext() override { return _inn.hasNext(); }